

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::FastFieldValuePrinterUtf8Escaping::PrintString
          (FastFieldValuePrinterUtf8Escaping *this,string *val,BaseTextGenerator *generator)

{
  string local_38;
  
  (*generator->_vptr_BaseTextGenerator[5])(generator,"\"",1);
  strings::Utf8SafeCEscape(&local_38,val);
  (*generator->_vptr_BaseTextGenerator[5])
            (generator,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__cxx11::string::~string((string *)&local_38);
  (*generator->_vptr_BaseTextGenerator[5])(generator,"\"",1);
  return;
}

Assistant:

void PrintString(const std::string& val,
                   TextFormat::BaseTextGenerator* generator) const override {
    generator->PrintLiteral("\"");
    generator->PrintString(strings::Utf8SafeCEscape(val));
    generator->PrintLiteral("\"");
  }